

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SurfaceBase.h
# Opt level: O3

void anurbs::SurfaceBase<2L>::register_python(module *m)

{
  class_<anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::SurfaceBase<2l>>> *pcVar1;
  class_<anurbs::SurfaceBase<2L>,_std::shared_ptr<anurbs::SurfaceBase<2L>_>_> *pcVar2;
  class_<anurbs::SurfaceBase<2L>,_std::shared_ptr<anurbs::SurfaceBase<2L>_>_> py_class;
  string name;
  anon_class_1_0_00000001 local_119;
  class_<anurbs::SurfaceBase<2L>,_std::shared_ptr<anurbs::SurfaceBase<2L>_>_> local_118;
  handle local_110;
  long *local_108;
  long local_f8 [2];
  arg local_e8;
  arg local_d8;
  arg local_c8;
  offset_in_Model_to_subr local_b8 [2];
  arg local_a8;
  arg local_98;
  offset_in_Model_to_subr local_88 [14];
  
  SurfaceBase<2l>::python_name_abi_cxx11_();
  pybind11::class_<anurbs::SurfaceBase<2L>,_std::shared_ptr<anurbs::SurfaceBase<2L>_>_>::class_<>
            (&local_118,(m->super_object).super_handle.m_ptr,(char *)local_108);
  local_88[0xc] = 0x11;
  local_88[0xd] = 0;
  pcVar1 = (class_<anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::SurfaceBase<2l>>> *)
           pybind11::class_<anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::SurfaceBase<2l>>>::
           def_property_readonly<long(anurbs::SurfaceBase<2l>::*)()const>
                     ((class_<anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::SurfaceBase<2l>>> *)
                      &local_118,"degree_u",local_88 + 0xc);
  local_88[10] = 0x19;
  local_88[0xb] = 0;
  pcVar1 = (class_<anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::SurfaceBase<2l>>> *)
           pybind11::class_<anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::SurfaceBase<2l>>>::
           def_property_readonly<long(anurbs::SurfaceBase<2l>::*)()const>
                     (pcVar1,"degree_v",local_88 + 10);
  pcVar1 = (class_<anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::SurfaceBase<2l>>> *)
           pybind11::class_<anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::SurfaceBase<2l>>>::
           def_property_readonly<anurbs::SurfaceBase<2l>::register_python(pybind11::module&)::_lambda(anurbs::SurfaceBase<2l>&)_1_>
                     (pcVar1,"dimension",&local_119);
  local_88[8] = 0x21;
  local_88[9] = 0;
  pcVar1 = (class_<anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::SurfaceBase<2l>>> *)
           pybind11::class_<anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::SurfaceBase<2l>>>::
           def_property_readonly<anurbs::Interval(anurbs::SurfaceBase<2l>::*)()const>
                     (pcVar1,"domain_u",local_88 + 8);
  local_88[6] = 0x29;
  local_88[7] = 0;
  pcVar1 = (class_<anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::SurfaceBase<2l>>> *)
           pybind11::class_<anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::SurfaceBase<2l>>>::
           def_property_readonly<anurbs::Interval(anurbs::SurfaceBase<2l>::*)()const>
                     (pcVar1,"domain_v",local_88 + 6);
  local_88[4] = 0x41;
  local_88[5] = 0;
  pcVar1 = (class_<anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::SurfaceBase<2l>>> *)
           pybind11::class_<anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::SurfaceBase<2l>>>::
           def_property_readonly<std::vector<anurbs::Interval,std::allocator<anurbs::Interval>>(anurbs::SurfaceBase<2l>::*)()const>
                     (pcVar1,"spans_u",local_88 + 4);
  local_88[2] = 0x49;
  local_88[3] = 0;
  pcVar1 = (class_<anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::SurfaceBase<2l>>> *)
           pybind11::class_<anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::SurfaceBase<2l>>>::
           def_property_readonly<std::vector<anurbs::Interval,std::allocator<anurbs::Interval>>(anurbs::SurfaceBase<2l>::*)()const>
                     (pcVar1,"spans_v",local_88 + 2);
  local_88[0] = 0x31;
  local_88[1] = 0;
  local_98.name = "u";
  local_98._8_1_ = 2;
  local_a8.name = "v";
  local_a8._8_1_ = 2;
  pcVar1 = (class_<anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::SurfaceBase<2l>>> *)
           pybind11::class_<anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::SurfaceBase<2l>>>::
           def<Eigen::Matrix<double,1,2,1,1,2>(anurbs::SurfaceBase<2l>::*)(double,double)const,pybind11::arg,pybind11::arg>
                     (pcVar1,"point_at",local_88,&local_98,&local_a8);
  local_b8[0] = 0x39;
  local_b8[1] = 0;
  local_c8.name = "u";
  local_c8._8_1_ = 2;
  local_d8.name = "v";
  local_d8._8_1_ = 2;
  local_e8.name = "order";
  local_e8._8_1_ = 2;
  pcVar2 = pybind11::class_<anurbs::SurfaceBase<2l>,std::shared_ptr<anurbs::SurfaceBase<2l>>>::
           def<std::vector<Eigen::Matrix<double,1,2,1,1,2>,std::allocator<Eigen::Matrix<double,1,2,1,1,2>>>(anurbs::SurfaceBase<2l>::*)(double,double,long)const,pybind11::arg,pybind11::arg,pybind11::arg>
                     (pcVar1,"derivatives_at",local_b8,&local_c8,&local_d8,&local_e8);
  local_110.m_ptr = (pcVar2->super_generic_type).super_object.super_handle.m_ptr;
  if (local_110.m_ptr != (PyObject *)0x0) {
    (local_110.m_ptr)->ob_refcnt = (local_110.m_ptr)->ob_refcnt + 1;
  }
  pybind11::object::~object((object *)&local_118);
  pybind11::object::~object((object *)&local_110);
  if (local_108 != local_f8) {
    operator_delete(local_108,local_f8[0] + 1);
  }
  return;
}

Assistant:

static void register_python(pybind11::module& m)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Type = SurfaceBase<TDimension>;
        using Holder = Pointer<Type>;

        const std::string name = Type::python_name();

        auto py_class = py::class_<Type, Holder>(m, name.c_str())
            // read-only property
            .def_property_readonly("degree_u", &Type::degree_u)
            .def_property_readonly("degree_v", &Type::degree_v)
            .def_property_readonly("dimension", [](Type&) {
                return Type::dimension(); })
            .def_property_readonly("domain_u", &Type::domain_u)
            .def_property_readonly("domain_v", &Type::domain_v)
            .def_property_readonly("spans_u", &Type::spans_u)
            .def_property_readonly("spans_v", &Type::spans_v)
            // methods
            .def("point_at", &Type::point_at, "u"_a, "v"_a)
            .def("derivatives_at", &Type::derivatives_at, "u"_a, "v"_a,
                "order"_a)
        ;

        if constexpr(dimension() == 3) {
            py_class.def("normal_at", &Type::normal_at, "u"_a, "v"_a);
        }
    }